

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

void __thiscall opts::BasicOption::~BasicOption(BasicOption *this)

{
  code *pcVar1;
  BasicOption *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual         ~BasicOption()                                                          {}